

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

xmlLinkPtr xmlListLinkSearch(xmlListPtr l,void *data)

{
  int iVar1;
  xmlLinkPtr pxVar2;
  xmlLinkPtr pxVar3;
  
  pxVar3 = l->sentinel;
  do {
    pxVar3 = pxVar3->next;
    if (pxVar3 == l->sentinel) break;
    iVar1 = (*l->linkCompare)(pxVar3->data,data);
  } while (iVar1 < 0);
  if (pxVar3 == l->sentinel) {
    pxVar2 = (xmlLinkPtr)0x0;
  }
  else {
    iVar1 = (*l->linkCompare)(pxVar3->data,data);
    pxVar2 = (xmlLinkPtr)0x0;
    if (iVar1 == 0) {
      pxVar2 = pxVar3;
    }
  }
  return pxVar2;
}

Assistant:

static xmlLinkPtr
xmlListLinkSearch(xmlListPtr l, void *data)
{
    xmlLinkPtr lk;
    if (l == NULL)
        return(NULL);
    lk = xmlListLowerSearch(l, data);
    if (lk == l->sentinel)
        return NULL;
    else {
        if (l->linkCompare(lk->data, data) ==0)
            return lk;
        return NULL;
    }
}